

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float __thiscall pbrt::PiecewiseConstant2D::PDF(PiecewiseConstant2D *this,Point2f *pr)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  size_t sVar4;
  const_reference this_00;
  const_reference pvVar5;
  long in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  int iy;
  int ix;
  Point2f p;
  Vector2<float> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float fVar8;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Tuple2<pbrt::Point2,_float> local_18 [3];
  undefined1 extraout_var [56];
  
  auVar7 = in_ZMM1._0_16_;
  auVar6._0_8_ = Bounds2<float>::Offset
                           ((Bounds2<float> *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (Point2<float> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  auVar6._8_56_ = extraout_var;
  vmovlpd_avx(auVar6._0_16_);
  Point2<float>::Point2<float>
            ((Point2<float> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](local_18,0);
  fVar8 = *pfVar3;
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
              *)(in_RDI + 0x10),0);
  sVar4 = PiecewiseConstant1D::size((PiecewiseConstant1D *)0x4cd1e7);
  auVar7 = vcvtusi2ss_avx512f(auVar7,sVar4);
  iVar1 = (int)(fVar8 * auVar7._0_4_);
  pstd::
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
  operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
              *)(in_RDI + 0x10),0);
  sVar4 = PiecewiseConstant1D::size((PiecewiseConstant1D *)0x4cd219);
  iVar1 = Clamp<int,int,unsigned_long>(iVar1,0,sVar4 - 1);
  pfVar3 = Tuple2<pbrt::Point2,_float>::operator[](local_18,1);
  fVar8 = *pfVar3;
  sVar4 = PiecewiseConstant1D::size((PiecewiseConstant1D *)0x4cd256);
  auVar7 = vcvtusi2ss_avx512f(auVar7,sVar4);
  iVar2 = (int)(fVar8 * auVar7._0_4_);
  sVar4 = PiecewiseConstant1D::size((PiecewiseConstant1D *)0x4cd27c);
  iVar2 = Clamp<int,int,unsigned_long>(iVar2,0,sVar4 - 1);
  this_00 = pstd::
            vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
            ::operator[]((vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
                          *)(in_RDI + 0x10),(long)iVar2);
  pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                     (&this_00->func,(long)iVar1);
  return *pvVar5 / *(float *)(in_RDI + 0x78);
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const Point2f &pr) const {
        Point2f p = Point2f(domain.Offset(pr));
        int ix =
            Clamp(int(p[0] * pConditionalY[0].size()), 0, pConditionalY[0].size() - 1);
        int iy = Clamp(int(p[1] * pMarginal.size()), 0, pMarginal.size() - 1);
        return pConditionalY[iy].func[ix] / pMarginal.funcInt;
    }